

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall
asmjit::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,uint32_t type,uint32_t size)

{
  DynamicBlock *pDVar1;
  Slot *pSVar2;
  undefined1 in_CL;
  undefined1 in_DL;
  undefined8 *in_RSI;
  ZoneHeap *in_RDI;
  RelocEntry *re;
  size_t index;
  Error _err;
  size_t allocatedSize;
  char *in_stack_00000310;
  int in_stack_0000031c;
  char *in_stack_00000320;
  uint in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  Slot **sizeOfT;
  ZoneVectorBase *in_stack_ffffffffffffff48;
  Error local_84;
  
  sizeOfT = in_RDI[2]._slots + 9;
  if (in_RDI[3]._zone == (Zone *)in_RDI[2]._dynamicBlocks) {
    local_84 = ZoneVectorBase::_grow
                         (in_stack_ffffffffffffff48,in_RDI,(size_t)sizeOfT,
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else {
    local_84 = 0;
  }
  if (local_84 == 0) {
    pDVar1 = in_RDI[2]._dynamicBlocks;
    if (pDVar1 < (DynamicBlock *)0x100000000) {
      if (in_RDI[1]._slots[3] == (Slot *)0x0) {
        DebugUtils::assertionFailed(in_stack_00000320,in_stack_0000031c,in_stack_00000310);
      }
      pSVar2 = (Slot *)ZoneHeap::_allocZeroed
                                 (in_RDI,(size_t)sizeOfT,(size_t *)(ulong)in_stack_ffffffffffffff30)
      ;
      if (pSVar2 == (Slot *)0x0) {
        local_84 = 1;
      }
      else {
        *(int *)&pSVar2->next = (int)pDVar1;
        *(undefined1 *)((long)&pSVar2->next + 4) = in_DL;
        *(undefined1 *)((long)&pSVar2->next + 5) = in_CL;
        *(undefined4 *)&pSVar2[1].next = 0xffffffff;
        *(undefined4 *)((long)&pSVar2[1].next + 4) = 0xffffffff;
        if (in_RDI[3]._zone <= (Zone *)in_RDI[2]._dynamicBlocks) {
          DebugUtils::assertionFailed(in_stack_00000320,in_stack_0000031c,in_stack_00000310);
        }
        in_RDI[2]._slots[9][(long)in_RDI[2]._dynamicBlocks].next = pSVar2;
        in_RDI[2]._dynamicBlocks = (DynamicBlock *)((long)&(in_RDI[2]._dynamicBlocks)->prev + 1);
        *in_RSI = pSVar2;
        local_84 = 0;
      }
    }
    else {
      local_84 = 0x14;
    }
  }
  return local_84;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, uint32_t type, uint32_t size) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_baseHeap));

  size_t index = _relocations.getLength();
  if (ASMJIT_UNLIKELY(index > size_t(0xFFFFFFFFU)))
    return DebugUtils::errored(kErrorRelocIndexOverflow);

  RelocEntry* re = _baseHeap.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorNoHeapMemory);

  re->_id = static_cast<uint32_t>(index);
  re->_type = static_cast<uint8_t>(type);
  re->_size = static_cast<uint8_t>(size);
  re->_sourceSectionId = SectionEntry::kInvalidId;
  re->_targetSectionId = SectionEntry::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}